

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tang_join_ti_impl.h
# Opt level: O3

void __thiscall
join::
TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::execute_join(TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
               *this,vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                     *trees_collection,
              vector<node::BinaryNode<label::StringLabel>,_std::allocator<node::BinaryNode<label::StringLabel>_>_>
              *binary_trees_collection,
              unordered_set<std::pair<int,_int>,_join::hashintegerpair,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              *candidates,
              vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *join_result
              ,double distance_threshold)

{
  Converter<label::StringLabel> btsc;
  Converter<label::StringLabel> local_31;
  double local_30;
  
  local_30 = distance_threshold;
  binary_tree_converter::Converter<label::StringLabel>::convert
            (&local_31,trees_collection,binary_trees_collection);
  retrieve_candidates(this,binary_trees_collection,candidates,local_30);
  verify_candidates(this,trees_collection,candidates,join_result,local_30);
  return;
}

Assistant:

void TangJoinTI<Label, VerificationAlgorithm>::execute_join(
    std::vector<node::Node<Label>>& trees_collection,
    std::vector<node::BinaryNode<Label>>& binary_trees_collection,
    std::unordered_set<std::pair<int, int>, hashintegerpair>& candidates,
    std::vector<join::JoinResultElement>& join_result,
    const double distance_threshold) {

  // Convert trees to sets and get the result.
  convert_trees_to_binary_trees(trees_collection, binary_trees_collection);

  // Compute candidates for the join using a partition-based algorithm
  retrieve_candidates(binary_trees_collection, candidates, distance_threshold);

  // Verify all computed join candidates and return the join result
  verify_candidates(trees_collection, candidates, join_result, distance_threshold);
}